

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

void Curl_pgrsTime(Curl_easy *data,timerid timer)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  time_t tVar7;
  timediff_t tVar8;
  long lVar9;
  int iVar10;
  timediff_t *ptVar11;
  curltime cVar12;
  curltime newer;
  curltime older;
  curltime older_00;
  
  cVar12 = Curl_now();
  tVar7 = cVar12.tv_sec;
  iVar10 = cVar12.tv_usec;
  switch(timer) {
  case TIMER_STARTOP:
    (data->progress).t_startop.tv_sec = tVar7;
    (data->progress).t_startop.tv_usec = iVar10;
    return;
  case TIMER_STARTSINGLE:
    (data->progress).t_startsingle.tv_sec = tVar7;
    (data->progress).t_startsingle.tv_usec = iVar10;
    puVar1 = &(data->progress).field_0x184;
    *puVar1 = *puVar1 & 0xfd;
    return;
  case TIMER_NAMELOOKUP:
    ptVar11 = &(data->progress).t_nslookup;
    break;
  case TIMER_CONNECT:
    ptVar11 = &(data->progress).t_connect;
    break;
  case TIMER_APPCONNECT:
    ptVar11 = &(data->progress).t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    ptVar11 = &(data->progress).t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    bVar2 = (data->progress).field_0x184;
    if ((bVar2 & 2) != 0) {
      return;
    }
    ptVar11 = &(data->progress).t_starttransfer;
    (data->progress).field_0x184 = bVar2 | 2;
    break;
  default:
    goto switchD_0010c5d7_caseD_8;
  case TIMER_STARTACCEPT:
    (data->progress).t_acceptdata.tv_sec = tVar7;
    (data->progress).t_acceptdata.tv_usec = iVar10;
    return;
  case TIMER_REDIRECT:
    uVar5 = (data->progress).start.tv_sec;
    uVar6 = (data->progress).start.tv_usec;
    older_00.tv_usec = uVar6;
    older_00.tv_sec = uVar5;
    cVar12._8_8_ = cVar12._8_8_ & 0xffffffff;
    cVar12.tv_sec = tVar7;
    older_00._12_4_ = 0;
    tVar8 = Curl_timediff_us(cVar12,older_00);
    (data->progress).t_redirect = tVar8;
    goto switchD_0010c5d7_caseD_8;
  }
  uVar3 = (data->progress).t_startsingle.tv_sec;
  uVar4 = (data->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar4;
  older.tv_sec = uVar3;
  newer._8_8_ = cVar12._8_8_ & 0xffffffff;
  newer.tv_sec = tVar7;
  older._12_4_ = 0;
  tVar8 = Curl_timediff_us(newer,older);
  lVar9 = 1;
  if (1 < tVar8) {
    lVar9 = tVar8;
  }
  *ptVar11 = *ptVar11 + lVar9;
switchD_0010c5d7_caseD_8:
  return;
}

Assistant:

void Curl_pgrsTime(struct Curl_easy *data, timerid timer)
{
  struct curltime now = Curl_now();
  timediff_t *delta = NULL;

  switch(timer) {
  default:
  case TIMER_NONE:
    /* mistake filter */
    break;
  case TIMER_STARTOP:
    /* This is set at the start of a transfer */
    data->progress.t_startop = now;
    break;
  case TIMER_STARTSINGLE:
    /* This is set at the start of each single fetch */
    data->progress.t_startsingle = now;
    data->progress.is_t_startransfer_set = false;
    break;
  case TIMER_STARTACCEPT:
    data->progress.t_acceptdata = now;
    break;
  case TIMER_NAMELOOKUP:
    delta = &data->progress.t_nslookup;
    break;
  case TIMER_CONNECT:
    delta = &data->progress.t_connect;
    break;
  case TIMER_APPCONNECT:
    delta = &data->progress.t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    delta = &data->progress.t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    delta = &data->progress.t_starttransfer;
    /* prevent updating t_starttransfer unless:
     *   1) this is the first time we're setting t_starttransfer
     *   2) a redirect has occurred since the last time t_starttransfer was set
     * This prevents repeated invocations of the function from incorrectly
     * changing the t_starttransfer time.
     */
    if(data->progress.is_t_startransfer_set) {
      return;
    }
    else {
      data->progress.is_t_startransfer_set = true;
      break;
    }
  case TIMER_POSTRANSFER:
    /* this is the normal end-of-transfer thing */
    break;
  case TIMER_REDIRECT:
    data->progress.t_redirect = Curl_timediff_us(now, data->progress.start);
    break;
  }
  if(delta) {
    timediff_t us = Curl_timediff_us(now, data->progress.t_startsingle);
    if(us < 1)
      us = 1; /* make sure at least one microsecond passed */
    *delta += us;
  }
}